

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O2

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
          (linear_node *this,undefined8 db,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  uint64_t uVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *archive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  long lVar3;
  unsigned_long uVar4;
  linear_node *__range3;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  unsigned_long local_80;
  index_pointer local_78;
  undefined8 local_60;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> existing_key;
  
  uVar1 = this->size_;
  lVar3 = 0;
  uVar4 = 0;
  archive = key;
  do {
    if (uVar1 << 3 == lVar3) {
      local_78.internal_ = (internal_node *)0x0;
      local_80 = 0xffffffffffffffff;
      break;
    }
    local_58 = *(undefined8 *)((long)&this->leaves_[0].a_ + lVar3);
    local_60 = db;
    serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
              (&existing_key,(serialize *)&local_60,(database_reader *)archive);
    _Var2 = std::operator==(&existing_key,key);
    if (_Var2) {
      local_78 = (index_pointer)((index_pointer *)((long)&this->leaves_[0].a_ + lVar3))->internal_;
      local_80 = uVar4;
    }
    else {
      uVar4 = uVar4 + 1;
    }
    std::__cxx11::string::~string((string *)&existing_key);
    lVar3 = lVar3 + 8;
    archive = extraout_RDX;
  } while (!_Var2);
  pVar5.second = local_80;
  pVar5.first.internal_ = local_78.internal_;
  return pVar5;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }